

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_print_glsl_visitor.cpp
# Opt level: O2

void __thiscall
ir_print_glsl_visitor::emit_assignment_part
          (ir_print_glsl_visitor *this,ir_dereference *lhs,ir_rvalue *rhs,uint write_mask,
          ir_rvalue *dstIndex)

{
  int iVar1;
  glsl_type *t;
  long lVar2;
  ulong uVar3;
  glsl_type *pgVar4;
  char mask [5];
  
  (*(lhs->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[2])(lhs);
  if (dstIndex == (ir_rvalue *)0x0) {
    t = (lhs->super_ir_rvalue).type;
    pgVar4 = rhs->type;
    if ((t->matrix_columns < 2) && (1 < t->vector_elements)) {
      uVar3 = 0;
      if ((-1 << (t->vector_elements & 0x1f) ^ write_mask) != 0xffffffff) {
        for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
          if ((write_mask >> ((uint)lVar2 & 0x1f) & 1) != 0) {
            mask[uVar3] = "xyzw"[lVar2];
            uVar3 = (ulong)((uint)uVar3 + 1);
          }
        }
        t = glsl_type::get_instance((uint)(byte)t->field_0x4,(uint)uVar3,1,0,false);
      }
      goto LAB_0015e08e;
    }
  }
  else {
    if ((dstIndex->super_ir_instruction).ir_type == ir_type_constant) {
      iVar1 = ir_constant::get_int_component((ir_constant *)dstIndex,0);
      string_buffer::asprintf_append(this->buffer,".%c",(ulong)(uint)(int)"xyzw"[iVar1]);
    }
    else {
      string_buffer::asprintf_append(this->buffer,"[");
      (*(dstIndex->super_ir_instruction)._vptr_ir_instruction[2])(dstIndex,this);
      string_buffer::asprintf_append(this->buffer,"]");
    }
    t = (lhs->super_ir_rvalue).type;
    pgVar4 = rhs->type;
  }
  uVar3 = 0;
LAB_0015e08e:
  mask[uVar3] = '\0';
  if (mask[0] != '\0') {
    string_buffer::asprintf_append(this->buffer,".%s",mask);
  }
  string_buffer::asprintf_append(this->buffer," = ");
  if ((dstIndex == (ir_rvalue *)0x0) && (t != pgVar4)) {
    if (mask[0] == '\0') {
      print_type(this->buffer,t,true);
      string_buffer::asprintf_append(this->buffer,"(");
      (*(rhs->super_ir_instruction)._vptr_ir_instruction[2])(rhs,this);
      string_buffer::asprintf_append(this->buffer,")");
    }
    else {
      string_buffer::asprintf_append(this->buffer,"(");
      (*(rhs->super_ir_instruction)._vptr_ir_instruction[2])(rhs,this);
      string_buffer::asprintf_append(this->buffer,")");
      string_buffer::asprintf_append(this->buffer,".%s",mask);
    }
  }
  else {
    (*(rhs->super_ir_instruction)._vptr_ir_instruction[2])(rhs,this);
  }
  return;
}

Assistant:

void ir_print_glsl_visitor::emit_assignment_part (ir_dereference* lhs, ir_rvalue* rhs, unsigned write_mask, ir_rvalue* dstIndex)
{
	lhs->accept(this);
	
	if (dstIndex)
	{
		// if dst index is a constant, then emit a swizzle
		ir_constant* dstConst = dstIndex->as_constant();
		if (dstConst)
		{
			const char* comps = "xyzw";
			char comp = comps[dstConst->get_int_component(0)];
			buffer.asprintf_append (".%c", comp);
		}
		else
		{
			buffer.asprintf_append ("[");
			dstIndex->accept(this);
			buffer.asprintf_append ("]");
		}
	}
	
	char mask[5];
	unsigned j = 0;
	const glsl_type* lhsType = lhs->type;
	const glsl_type* rhsType = rhs->type;
	if (!dstIndex && lhsType->matrix_columns <= 1 && lhsType->vector_elements > 1 && write_mask != (1<<lhsType->vector_elements)-1)
	{
		for (unsigned i = 0; i < 4; i++) {
			if ((write_mask & (1 << i)) != 0) {
				mask[j] = "xyzw"[i];
				j++;
			}
		}
		lhsType = glsl_type::get_instance(lhsType->base_type, j, 1);
	}
	mask[j] = '\0';
	bool hasWriteMask = false;
	if (mask[0])
	{
		buffer.asprintf_append (".%s", mask);
		hasWriteMask = true;
	}
	
	buffer.asprintf_append (" = ");
	
	bool typeMismatch = !dstIndex && (lhsType != rhsType);
	const bool addSwizzle = hasWriteMask && typeMismatch;
	if (typeMismatch)
	{
		if (!addSwizzle)
			print_type(buffer, lhsType, true);
		buffer.asprintf_append ("(");
	}
	
	rhs->accept(this);
	
	if (typeMismatch)
	{
		buffer.asprintf_append (")");
		if (addSwizzle)
			buffer.asprintf_append (".%s", mask);
	}
}